

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1objs.c
# Opt level: O0

FT_Error T1_Size_Init(FT_Size t1size)

{
  T1_Face face;
  PSH_Globals globals;
  PSH_Globals_Funcs funcs;
  FT_Size pFStack_18;
  FT_Error error;
  T1_Size size;
  FT_Size t1size_local;
  
  funcs._4_4_ = 0;
  pFStack_18 = t1size;
  size = (T1_Size)t1size;
  globals = (PSH_Globals)T1_Size_Get_Globals_Funcs((T1_Size)t1size);
  if ((globals != (PSH_Globals)0x0) &&
     (funcs._4_4_ = (*(code *)globals->memory)
                              (pFStack_18->face->memory,&pFStack_18->face[1].available_sizes,&face),
     funcs._4_4_ == 0)) {
    ((size->root).internal)->module_data = face;
  }
  return funcs._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Size_Init( FT_Size  t1size )      /* T1_Size */
  {
    T1_Size            size  = (T1_Size)t1size;
    FT_Error           error = FT_Err_Ok;
    PSH_Globals_Funcs  funcs = T1_Size_Get_Globals_Funcs( size );


    if ( funcs )
    {
      PSH_Globals  globals;
      T1_Face      face = (T1_Face)size->root.face;


      error = funcs->create( size->root.face->memory,
                             &face->type1.private_dict, &globals );
      if ( !error )
        t1size->internal->module_data = globals;
    }

    return error;
  }